

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphcycles.cc
# Opt level: O2

void __thiscall xla::GraphCycles::RemoveNode(GraphCycles *this,int32_t node)

{
  pointer this_00;
  pointer pNVar1;
  int *piVar2;
  pointer piVar3;
  int *piVar4;
  pointer piVar5;
  vector<int,_std::allocator<int>_> *__range1;
  value_type_conflict1 local_34;
  
  pNVar1 = (this->rep_->node_io_).
           super__Vector_base<xla::(anonymous_namespace)::NodeIO,_std::allocator<xla::(anonymous_namespace)::NodeIO>_>
           ._M_impl.super__Vector_impl_data._M_start;
  this_00 = pNVar1 + node;
  piVar2 = *(pointer *)
            ((long)&pNVar1[node].out.value_sequence_.super__Vector_base<int,_std::allocator<int>_> +
            8);
  for (piVar4 = pNVar1[node].out.value_sequence_.super__Vector_base<int,_std::allocator<int>_>.
                _M_impl.super__Vector_impl_data._M_start; piVar4 != piVar2; piVar4 = piVar4 + 1) {
    OrderedSet<int>::Erase
              (&(this->rep_->node_io_).
                super__Vector_base<xla::(anonymous_namespace)::NodeIO,_std::allocator<xla::(anonymous_namespace)::NodeIO>_>
                ._M_impl.super__Vector_impl_data._M_start[*piVar4].in,node);
  }
  piVar3 = (this_00->in).value_sequence_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (piVar5 = (this_00->in).value_sequence_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start; piVar5 != piVar3; piVar5 = piVar5 + 1) {
    OrderedSet<int>::Erase
              (&(this->rep_->node_io_).
                super__Vector_base<xla::(anonymous_namespace)::NodeIO,_std::allocator<xla::(anonymous_namespace)::NodeIO>_>
                ._M_impl.super__Vector_impl_data._M_start[*piVar5].out,node);
  }
  OrderedSet<int>::Clear(&this_00->in);
  OrderedSet<int>::Clear(&pNVar1[node].out);
  std::vector<int,_std::allocator<int>_>::push_back(&this->rep_->free_nodes_,&local_34);
  return;
}

Assistant:

void GraphCycles::RemoveNode(int32_t node) {
  NodeIO* x = &rep_->node_io_[node];
  for (int32_t y : x->out.GetSequence()) {
    rep_->node_io_[y].in.Erase(node);
  }
  for (int32_t y : x->in.GetSequence()) {
    rep_->node_io_[y].out.Erase(node);
  }
  x->in.Clear();
  x->out.Clear();
  rep_->free_nodes_.push_back(node);
}